

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::setFromSignUnbiasedExponentAndNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this,bool negative,int_type exponent,uint_type significand,bool round_denorm_up)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar2 = (ulong)(significand >> 1 | 0x400000);
  if (-0x7f < exponent) {
    uVar2 = (ulong)significand;
  }
  iVar4 = exponent;
  if (exponent < -0x7f) {
    iVar4 = exponent + 0x7f;
    do {
      uVar2 = uVar2 >> 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
    iVar4 = -0x7f;
  }
  uVar1 = (uint)uVar2;
  if ((int)(iVar4 + 0x7fU) < 0) {
    __assert_fail("exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                  ,0x1c9,
                  "void spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>>::setFromSignUnbiasedExponentAndNormalizedSignificand(bool, int_type, uint_type, bool) [T = spvtools::utils::FloatProxy<float>, Traits = spvtools::utils::HexFloatTraits<FloatProxy<float>>]"
                 );
  }
  uVar3 = (uint)round_denorm_up;
  if (iVar4 != -0x7f || uVar1 != 0) {
    uVar3 = uVar1;
  }
  if (significand != 0) {
    uVar1 = uVar3;
  }
  if (exponent < -0x7e) {
    uVar1 = uVar3;
  }
  (this->value_).data_ = uVar1 & 0x7fffff | (iVar4 + 0x7fU & 0xff) << 0x17 | (uint)negative << 0x1f;
  return;
}

Assistant:

void setFromSignUnbiasedExponentAndNormalizedSignificand(
      bool negative, int_type exponent, uint_type significand,
      bool round_denorm_up) {
    bool significand_is_zero = significand == 0;

    if (exponent <= min_exponent) {
      // If this was denormalized, then we have to shift the bit on, meaning
      // the significand is not zero.
      significand_is_zero = false;
      significand |= first_exponent_bit;
      significand = static_cast<uint_type>(significand >> 1);
    }

    while (exponent < min_exponent) {
      significand = static_cast<uint_type>(significand >> 1);
      ++exponent;
    }

    if (exponent == min_exponent) {
      if (significand == 0 && !significand_is_zero && round_denorm_up) {
        significand = static_cast<uint_type>(0x1);
      }
    }

    uint_type new_value = 0;
    if (negative) {
      new_value = static_cast<uint_type>(new_value | sign_mask);
    }
    exponent = static_cast<int_type>(exponent + exponent_bias);
    assert(exponent >= 0);

    // put it all together
    exponent = static_cast<uint_type>((exponent << exponent_left_shift) &
                                      exponent_mask);
    significand = static_cast<uint_type>(significand & fraction_encode_mask);
    new_value = static_cast<uint_type>(new_value | (exponent | significand));
    value_ = T(new_value);
  }